

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UChar * icu_63::ZoneMeta::getCanonicalCLDRID(UnicodeString *tzid,UErrorCode *status)

{
  UErrorCode *this;
  UBool UVar1;
  int32_t iVar2;
  UResourceBundle *pUVar3;
  UResourceBundle *resB;
  UnicodeString *pUVar4;
  UnicodeString *pUVar5;
  void *pvVar6;
  UChar *pUVar7;
  UChar *canonicalInCache;
  UChar *key;
  UChar *idInCache;
  char *q;
  int32_t len;
  UChar *derefer;
  UChar *canonical;
  UResourceBundle *rb;
  UResourceBundle *top;
  char *p;
  char id [129];
  bool local_14d;
  UBool isInputCanonical;
  Char16Ptr local_140;
  char16_t local_138 [4];
  UChar utzid [129];
  UErrorCode local_2c;
  UnicodeString *pUStack_28;
  UErrorCode tmpStatus;
  UChar *canonicalID;
  UErrorCode *status_local;
  UnicodeString *tzid_local;
  
  canonicalID = (UChar *)status;
  status_local = (UErrorCode *)tzid;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = UnicodeString::isBogus((UnicodeString *)status_local);
    if ((UVar1 == '\0') &&
       (iVar2 = UnicodeString::length((UnicodeString *)status_local), iVar2 < 0x81)) {
      umtx_initOnce(&gCanonicalIDCacheInitOnce,initCanonicalIDCache,(UErrorCode *)canonicalID);
      UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID);
      this = status_local;
      if (UVar1 == '\0') {
        pUStack_28 = (UnicodeString *)0x0;
        local_2c = U_ZERO_ERROR;
        Char16Ptr::Char16Ptr(&local_140,local_138);
        UnicodeString::extract((UnicodeString *)this,&local_140,0x81,&local_2c);
        Char16Ptr::~Char16Ptr(&local_140);
        UVar1 = uprv_isInvariantUString_63(local_138,-1);
        if (UVar1 == '\0') {
          canonicalID[0] = L'\x01';
          canonicalID[1] = L'\0';
          tzid_local = (UnicodeString *)0x0;
        }
        else {
          umtx_lock_63(&gZoneMetaLock);
          pUStack_28 = (UnicodeString *)uhash_get_63(gCanonicalIDCache,local_138);
          umtx_unlock_63(&gZoneMetaLock);
          if (pUStack_28 == (UnicodeString *)0x0) {
            UnicodeString::extract
                      ((UnicodeString *)status_local,0,0x7fffffff,(char *)&p,0x81,kInvariant);
            top = (UResourceBundle *)&p;
            while (pUVar3 = (UResourceBundle *)((long)&top->fKey + 1), *(char *)&top->fKey != '\0')
            {
              top = pUVar3;
              if (*(char *)&pUVar3->fKey == '/') {
                *(undefined1 *)&pUVar3->fKey = 0x3a;
              }
            }
            pUVar3 = ures_openDirect_63((char *)0x0,"keyTypeData",&local_2c);
            resB = ures_getByKey_63(pUVar3,"typeMap",(UResourceBundle *)0x0,&local_2c);
            ures_getByKey_63(resB,"timezone",resB,&local_2c);
            ures_getByKey_63(resB,(char *)&p,resB,&local_2c);
            UVar1 = ::U_SUCCESS(local_2c);
            local_14d = UVar1 != '\0';
            if (local_14d) {
              pUStack_28 = (UnicodeString *)TimeZone::findID((UnicodeString *)status_local);
            }
            if (pUStack_28 == (UnicodeString *)0x0) {
              local_2c = U_ZERO_ERROR;
              ures_getByKey_63(pUVar3,"typeAlias",resB,&local_2c);
              ures_getByKey_63(resB,"timezone",resB,&local_2c);
              pUVar4 = (UnicodeString *)
                       ures_getStringByKey_63(resB,(char *)&p,(int32_t *)0x0,&local_2c);
              UVar1 = ::U_SUCCESS(local_2c);
              if (UVar1 != '\0') {
                pUStack_28 = pUVar4;
              }
              if (pUStack_28 == (UnicodeString *)0x0) {
                pUVar4 = (UnicodeString *)TimeZone::dereferOlsonLink((UnicodeString *)status_local);
                if (pUVar4 == (UnicodeString *)0x0) {
                  canonicalID[0] = L'\x01';
                  canonicalID[1] = L'\0';
                }
                else {
                  iVar2 = u_strlen_63((UChar *)pUVar4);
                  u_UCharsToChars_63((UChar *)pUVar4,(char *)&p,iVar2);
                  id[(long)iVar2 + -8] = '\0';
                  idInCache = (UChar *)&p;
                  while (pUVar7 = (UChar *)((long)idInCache + 1), (char)*idInCache != '\0') {
                    idInCache = pUVar7;
                    if (*(char *)pUVar7 == '/') {
                      *(char *)pUVar7 = ':';
                    }
                  }
                  local_2c = U_ZERO_ERROR;
                  pUVar5 = (UnicodeString *)
                           ures_getStringByKey_63(resB,(char *)&p,(int32_t *)0x0,&local_2c);
                  UVar1 = ::U_SUCCESS(local_2c);
                  pUStack_28 = pUVar4;
                  if (UVar1 != '\0') {
                    pUStack_28 = pUVar5;
                  }
                  local_14d = UVar1 == '\0' || local_14d;
                }
              }
            }
            ures_close_63(resB);
            ures_close_63(pUVar3);
            UVar1 = ::U_SUCCESS(*(UErrorCode *)canonicalID);
            if (UVar1 != '\0') {
              umtx_lock_63(&gZoneMetaLock);
              pvVar6 = uhash_get_63(gCanonicalIDCache,local_138);
              if ((pvVar6 == (void *)0x0) &&
                 (pUVar7 = findTimeZoneID((UnicodeString *)status_local), pUVar7 != (UChar *)0x0)) {
                uhash_put_63(gCanonicalIDCache,pUVar7,pUStack_28,(UErrorCode *)canonicalID);
              }
              UVar1 = ::U_SUCCESS(*(UErrorCode *)canonicalID);
              if (((UVar1 != '\0') && (local_14d)) &&
                 (pvVar6 = uhash_get_63(gCanonicalIDCache,pUStack_28), pvVar6 == (void *)0x0)) {
                uhash_put_63(gCanonicalIDCache,pUStack_28,pUStack_28,(UErrorCode *)canonicalID);
              }
              umtx_unlock_63(&gZoneMetaLock);
            }
            tzid_local = pUStack_28;
          }
          else {
            tzid_local = pUStack_28;
          }
        }
      }
      else {
        tzid_local = (UnicodeString *)0x0;
      }
    }
    else {
      canonicalID[0] = L'\x01';
      canonicalID[1] = L'\0';
      tzid_local = (UnicodeString *)0x0;
    }
  }
  else {
    tzid_local = (UnicodeString *)0x0;
  }
  return (UChar *)tzid_local;
}

Assistant:

const UChar* U_EXPORT2
ZoneMeta::getCanonicalCLDRID(const UnicodeString &tzid, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }

    if (tzid.isBogus() || tzid.length() > ZID_KEY_MAX) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    // Checking the cached results
    umtx_initOnce(gCanonicalIDCacheInitOnce, &initCanonicalIDCache, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    const UChar *canonicalID = NULL;

    UErrorCode tmpStatus = U_ZERO_ERROR;
    UChar utzid[ZID_KEY_MAX + 1];
    tzid.extract(utzid, ZID_KEY_MAX + 1, tmpStatus);
    U_ASSERT(tmpStatus == U_ZERO_ERROR);    // we checked the length of tzid already

    if (!uprv_isInvariantUString(utzid, -1)) {
        // All of known tz IDs are only containing ASCII invariant characters.
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    // Check if it was already cached
    umtx_lock(&gZoneMetaLock);
    {
        canonicalID = (const UChar *)uhash_get(gCanonicalIDCache, utzid);
    }
    umtx_unlock(&gZoneMetaLock);

    if (canonicalID != NULL) {
        return canonicalID;
    }

    // If not, resolve CLDR canonical ID with resource data
    UBool isInputCanonical = FALSE;
    char id[ZID_KEY_MAX + 1];
    tzid.extract(0, 0x7fffffff, id, UPRV_LENGTHOF(id), US_INV);

    // replace '/' with ':'
    char *p = id;
    while (*p++) {
        if (*p == '/') {
            *p = ':';
        }
    }

    UResourceBundle *top = ures_openDirect(NULL, gKeyTypeData, &tmpStatus);
    UResourceBundle *rb = ures_getByKey(top, gTypeMapTag, NULL, &tmpStatus);
    ures_getByKey(rb, gTimezoneTag, rb, &tmpStatus);
    ures_getByKey(rb, id, rb, &tmpStatus);
    if (U_SUCCESS(tmpStatus)) {
        // type entry (canonical) found
        // the input is the canonical ID. resolve to const UChar*
        canonicalID = TimeZone::findID(tzid);
        isInputCanonical = TRUE;
    }

    if (canonicalID == NULL) {
        // If a map element not found, then look for an alias
        tmpStatus = U_ZERO_ERROR;
        ures_getByKey(top, gTypeAliasTag, rb, &tmpStatus);
        ures_getByKey(rb, gTimezoneTag, rb, &tmpStatus);
        const UChar *canonical = ures_getStringByKey(rb,id,NULL,&tmpStatus);
        if (U_SUCCESS(tmpStatus)) {
            // canonical map found
            canonicalID = canonical;
        }

        if (canonicalID == NULL) {
            // Dereference the input ID using the tz data
            const UChar *derefer = TimeZone::dereferOlsonLink(tzid);
            if (derefer == NULL) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                int32_t len = u_strlen(derefer);
                u_UCharsToChars(derefer,id,len);
                id[len] = (char) 0; // Make sure it is null terminated.

                // replace '/' with ':'
                char *q = id;
                while (*q++) {
                    if (*q == '/') {
                        *q = ':';
                    }
                }

                // If a dereference turned something up then look for an alias.
                // rb still points to the alias table, so we don't have to go looking
                // for it.
                tmpStatus = U_ZERO_ERROR;
                canonical = ures_getStringByKey(rb,id,NULL,&tmpStatus);
                if (U_SUCCESS(tmpStatus)) {
                    // canonical map for the dereferenced ID found
                    canonicalID = canonical;
                } else {
                    canonicalID = derefer;
                    isInputCanonical = TRUE;
                }
            }
        }
    }
    ures_close(rb);
    ures_close(top);

    if (U_SUCCESS(status)) {
        U_ASSERT(canonicalID != NULL);  // canocanilD must be non-NULL here

        // Put the resolved canonical ID to the cache
        umtx_lock(&gZoneMetaLock);
        {
            const UChar* idInCache = (const UChar *)uhash_get(gCanonicalIDCache, utzid);
            if (idInCache == NULL) {
                const UChar* key = ZoneMeta::findTimeZoneID(tzid);
                U_ASSERT(key != NULL);
                if (key != NULL) {
                    idInCache = (const UChar *)uhash_put(gCanonicalIDCache, (void *)key, (void *)canonicalID, &status);
                    U_ASSERT(idInCache == NULL);
                }
            }
            if (U_SUCCESS(status) && isInputCanonical) {
                // Also put canonical ID itself into the cache if not exist
                const UChar *canonicalInCache = (const UChar*)uhash_get(gCanonicalIDCache, canonicalID);
                if (canonicalInCache == NULL) {
                    canonicalInCache = (const UChar *)uhash_put(gCanonicalIDCache, (void *)canonicalID, (void *)canonicalID, &status);
                    U_ASSERT(canonicalInCache == NULL);
                }
            }
        }
        umtx_unlock(&gZoneMetaLock);
    }

    return canonicalID;
}